

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManFindOneUnate(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t **vUnateLits,
                       Vec_Int_t **vNotUnateVars,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  bool bVar3;
  Vec_Ptr_t *pOn;
  Vec_Ptr_t *pVVar4;
  
  pOn = vDivs;
  if (fVerbose != 0) {
    printf("  ");
  }
  pVVar4 = (Vec_Ptr_t *)0x0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    Gia_ManFindOneUnateInt
              (pSets[(long)pVVar4],(word *)pOn,vDivs,nWords,vUnateLits[(long)pVVar4],
               vNotUnateVars[(long)pVVar4]);
    iVar2 = extraout_EDX;
    if (fVerbose != 0) {
      printf("U%d =%4d ",pVVar4,(ulong)(uint)vUnateLits[(long)pVVar4]->nSize);
      pOn = pVVar4;
      iVar2 = extraout_EDX_00;
    }
    pVVar4 = (Vec_Ptr_t *)0x1;
    bVar1 = false;
  } while (bVar3);
  iVar2 = Gia_ManFindFirstCommonLit(*vUnateLits,vUnateLits[1],iVar2);
  return iVar2;
}

Assistant:

int Gia_ManFindOneUnate( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits[2], Vec_Int_t * vNotUnateVars[2], int fVerbose )
{
    int n;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManFindOneUnateInt( pSets[n], pSets[!n], vDivs, nWords, vUnateLits[n], vNotUnateVars[n] );
        if ( fVerbose ) printf( "U%d =%4d ", n, Vec_IntSize(vUnateLits[n]) );
    }
    return Gia_ManFindFirstCommonLit( vUnateLits[0], vUnateLits[1], fVerbose );
}